

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall deqp::gls::AttributePack::newArray(AttributePack *this,Storage storage)

{
  AttributeArray *this_00;
  AttributeArray *local_20;
  Storage local_14;
  AttributePack *pAStack_10;
  Storage storage_local;
  AttributePack *this_local;
  
  local_14 = storage;
  pAStack_10 = this;
  this_00 = (AttributeArray *)operator_new(0x58);
  anon_unknown_1::AttributeArray::AttributeArray(this_00,local_14,this->m_ctx);
  local_20 = this_00;
  std::
  vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  ::push_back(&this->m_arrays,&local_20);
  return;
}

Assistant:

void AttributePack::newArray (DrawTestSpec::Storage storage)
{
	m_arrays.push_back(new AttributeArray(storage, m_ctx));
}